

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O1

bool __thiscall
FlatSigningProvider::GetKeyOrigin(FlatSigningProvider *this,CKeyID *keyid,KeyOriginInfo *info)

{
  bool bVar1;
  long in_FS_OFFSET;
  pair<CPubKey,_KeyOriginInfo> out;
  pair<CPubKey,_KeyOriginInfo> local_80;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_80.first.vch[0] = 0xff;
  local_80.second.fingerprint[0] = '\0';
  local_80.second.fingerprint[1] = '\0';
  local_80.second.fingerprint[2] = '\0';
  local_80.second.fingerprint[3] = '\0';
  local_80.second._4_4_ = 0;
  local_80.second.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_80.second.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80.second.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = LookupHelper<std::map<CKeyID,std::pair<CPubKey,KeyOriginInfo>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>>>,CKeyID,std::pair<CPubKey,KeyOriginInfo>>
                    (&this->origins,keyid,&local_80);
  if (bVar1) {
    *&info->fingerprint = local_80.second.fingerprint;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(&info->path);
  }
  if (local_80.second.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.second.path.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.second.path.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.second.path.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool FlatSigningProvider::GetKeyOrigin(const CKeyID& keyid, KeyOriginInfo& info) const
{
    std::pair<CPubKey, KeyOriginInfo> out;
    bool ret = LookupHelper(origins, keyid, out);
    if (ret) info = std::move(out.second);
    return ret;
}